

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mraa.c
# Opt level: O1

int mraa_find_i2c_bus_pci(char *pci_device,char *pci_id,char *adapter_name)

{
  mraa_boolean_t mVar1;
  uint uVar2;
  int iVar3;
  mraa_result_t mVar4;
  char *__ptr;
  char *pcVar5;
  ulong uVar6;
  ulong unaff_RBP;
  int iVar7;
  bool bVar8;
  char delim;
  dirent **namelist;
  int ret;
  char *dup;
  char path [1024];
  char local_459;
  dirent **local_458;
  uint local_44c;
  char *local_448;
  char *local_440;
  char local_438 [1032];
  
  snprintf(local_438,0x3ff,"/sys/devices/pci%s/%s/%s/",pci_device,pci_id,adapter_name);
  mVar1 = mraa_file_exist(local_438);
  if (mVar1 != 0) {
    uVar2 = scandir(local_438,&local_458,(__selector *)0x0,alphasort);
    if ((int)uVar2 < 0) {
      bVar8 = false;
      syslog(3,"Failed to get information on i2c");
      iVar3 = -1;
    }
    else {
      uVar6 = (ulong)uVar2;
      local_448 = adapter_name;
      do {
        iVar3 = (int)unaff_RBP;
        bVar8 = uVar6 == 0;
        uVar6 = uVar6 - 1;
        if (bVar8) goto LAB_001094a6;
        __ptr = strdup(local_458[uVar6]->d_name);
        local_440 = __ptr;
        if (__ptr == (char *)0x0) {
          iVar7 = 3;
          syslog(3,"Ran out of memory!");
        }
        else {
          local_459 = '-';
          pcVar5 = strsep(&local_440,&local_459);
          if (((pcVar5 == (char *)0x0) || (iVar3 = strncmp("i2c",pcVar5,3), iVar3 != 0)) ||
             (pcVar5 = strsep(&local_440,&local_459), pcVar5 == (char *)0x0)) {
            free(__ptr);
            free(local_458[uVar6]);
            iVar7 = 0;
          }
          else {
            local_44c = 0xffffffff;
            mVar4 = mraa_atoi(pcVar5,(int *)&local_44c);
            free(__ptr);
            free(local_458[uVar6]);
            free(local_458);
            unaff_RBP = 0xffffffff;
            if (mVar4 == MRAA_SUCCESS) {
              unaff_RBP = (ulong)local_44c;
              syslog(5,"Adding i2c bus found on i2c-%d on adapter %s",unaff_RBP,local_448);
            }
            iVar7 = 1;
          }
        }
        iVar3 = (int)unaff_RBP;
      } while (iVar7 == 0);
      if (iVar7 == 3) {
LAB_001094a6:
        free(local_458);
        bVar8 = true;
      }
      else {
        bVar8 = false;
      }
    }
    if (!bVar8) {
      return iVar3;
    }
  }
  return -1;
}

Assistant:

int
mraa_find_i2c_bus_pci(const char* pci_device, const char* pci_id, const char* adapter_name)
{
    /**
     * For example we'd get something like:
     * pci0000:00/0000:00:16.3/i2c_desiignware.3
     */
    char path[1024];
    snprintf(path, 1024 - 1, "/sys/devices/pci%s/%s/%s/", pci_device, pci_id, adapter_name);
    if (mraa_file_exist(path)) {
        struct dirent** namelist;
        int n;
        n = scandir(path, &namelist, NULL, alphasort);
        if (n < 0) {
            syslog(LOG_ERR, "Failed to get information on i2c");
            return -1;
        } else {
            while (n--) {
                char* dup = strdup(namelist[n]->d_name);
                char* orig_dup = dup;
                if (dup == NULL) {
                    syslog(LOG_ERR, "Ran out of memory!");
                    break;
                }
                const char delim = '-';
                char* token;
                token = strsep(&dup, &delim);
                if (token != NULL) {
                    if (strncmp("i2c", token, 3) == 0) {
                        token = strsep(&dup, &delim);
                        if (token != NULL) {
                            int ret = -1;
                            if (mraa_atoi(token, &ret) == MRAA_SUCCESS) {
                                free(orig_dup);
                                free(namelist[n]);
                                free(namelist);
                                syslog(LOG_NOTICE, "Adding i2c bus found on i2c-%d on adapter %s", ret, adapter_name);
                                return ret;
                            }
                            free(orig_dup);
                            free(namelist[n]);
                            free(namelist);
                            return -1;
                        }
                    }
                }
                free(orig_dup);
                free(namelist[n]);
            }
            free(namelist);
        }
    }
    return -1;
}